

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void insch(Terminal *term,wchar_t n)

{
  wchar_t wVar1;
  wchar_t x;
  wchar_t wVar2;
  wchar_t wVar3;
  bool bVar4;
  wchar_t wVar5;
  uint uVar6;
  termline *line;
  wchar_t wVar7;
  wchar_t y;
  termchar *ptVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  wchar_t wVar15;
  long lVar16;
  
  wVar11 = -n;
  wVar2 = n;
  if (n < L'\x01') {
    wVar2 = wVar11;
  }
  wVar1 = term->cols;
  x = (term->curs).x;
  wVar15 = wVar1 - x;
  if (wVar15 <= wVar2) {
    wVar2 = wVar15;
  }
  wVar5 = (term->selend).x;
  y = (term->curs).y;
  wVar7 = (term->selend).y;
  bVar4 = (term->curs).x < wVar5;
  if (y != wVar7) {
    bVar4 = y < wVar7;
  }
  if (bVar4) {
    wVar10 = (term->selstart).x;
    wVar9 = (term->selstart).y;
    bVar4 = wVar10 < wVar1;
    if (y != wVar9) {
      bVar4 = wVar9 < y;
    }
    if (bVar4) {
      wVar3 = x + wVar2;
      if (L'\xffffffff' < n) {
        wVar3 = x;
      }
      bVar4 = y < wVar9;
      if (y == wVar9) {
        bVar4 = wVar3 <= wVar10;
      }
      if (bVar4) {
        wVar9 = L'\0';
        if (L'\xffffffff' < n) {
          wVar9 = wVar2;
        }
        bVar4 = wVar7 < y;
        if (y == wVar7) {
          bVar4 = wVar5 <= wVar1 - wVar9;
        }
        if (bVar4) {
          wVar7 = -wVar2;
          if (L'\xffffffff' < n) {
            wVar7 = wVar2;
          }
          wVar10 = wVar10 + wVar7;
          (term->selstart).x = wVar10;
          wVar7 = wVar7 + wVar5;
          (term->selend).x = wVar7;
          if (wVar10 < x) {
            __assert_fail("term->selstart.x >= term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7d,"void insch(Terminal *, int)");
          }
          if (wVar1 <= wVar10) {
            __assert_fail("term->selstart.x < term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7e,"void insch(Terminal *, int)");
          }
          if (wVar7 <= x) {
            __assert_fail("term->selend.x > term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7f,"void insch(Terminal *, int)");
          }
          if (wVar1 < wVar7) {
            __assert_fail("term->selend.x <= term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb80,"void insch(Terminal *, int)");
          }
          goto LAB_00113385;
        }
      }
      term->selstate = LEXICOGRAPHIC;
      (term->selstart).y = L'\0';
      (term->selstart).x = L'\0';
      (term->selend).y = L'\0';
      (term->selend).x = L'\0';
    }
  }
LAB_00113385:
  check_boundary(term,x,y);
  if (n < L'\0') {
    check_boundary(term,(term->curs).x + wVar2,(term->curs).y);
  }
  line = lineptr(term,(term->curs).y,L'஋',L'\x01');
  if (line->trusted != term->trusted) {
    clear_line(term,line);
    line->trusted = term->trusted;
  }
  uVar6 = wVar1 - (x + wVar2);
  if (n < L'\0') {
    if (0 < (int)uVar6) {
      lVar16 = 0;
      uVar14 = 0;
      do {
        ptVar8 = (termchar *)((long)&line->chars[(term->curs).x].chr + lVar16);
        move_termchar(line,ptVar8,ptVar8 + wVar2);
        uVar14 = uVar14 + 1;
        lVar16 = lVar16 + 0x20;
      } while (uVar14 < uVar6);
    }
    if (wVar1 != x) {
      if (n != wVar11 && SBORROW4(n,wVar11) == n * 2 < 0) {
        wVar11 = n;
      }
      if (wVar15 <= wVar11) {
        wVar11 = wVar15;
      }
      iVar12 = -wVar11;
      do {
        copy_termchar(line,iVar12 + wVar15 + (term->curs).x,&term->erase_char);
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
    }
  }
  else {
    if (uVar6 != 0) {
      wVar5 = wVar15;
      if (n < wVar15) {
        wVar5 = n;
      }
      lVar16 = (long)(wVar1 - (x + wVar5));
      lVar13 = -lVar16;
      lVar16 = lVar16 << 5;
      do {
        ptVar8 = (termchar *)((long)&line->chars[(long)(term->curs).x + -1].chr + lVar16);
        move_termchar(line,ptVar8 + wVar2,ptVar8);
        lVar13 = lVar13 + 1;
        lVar16 = lVar16 + -0x20;
      } while (lVar13 != 0);
    }
    if (wVar2 != L'\0') {
      if (n != wVar11 && SBORROW4(n,wVar11) == n * 2 < 0) {
        wVar11 = n;
      }
      if (wVar15 <= wVar11) {
        wVar11 = wVar15;
      }
      do {
        wVar11 = wVar11 + L'\xffffffff';
        copy_termchar(line,(term->curs).x + wVar11,&term->erase_char);
      } while (wVar11 != L'\0');
    }
  }
  return;
}

Assistant:

static void insch(Terminal *term, int n)
{
    int dir = (n < 0 ? -1 : +1);
    int m, j;
    pos eol;
    termline *ldata;

    n = (n < 0 ? -n : n);
    if (n > term->cols - term->curs.x)
        n = term->cols - term->curs.x;
    m = term->cols - term->curs.x - n;

    /*
     * We must de-highlight the selection if it overlaps any part of
     * the region affected by this operation, i.e. the region from the
     * current cursor position to end-of-line, _unless_ the entirety
     * of the selection is going to be moved to the left or right by
     * this operation but otherwise unchanged, in which case we can
     * simply move the highlight with the text.
     */
    eol.y = term->curs.y;
    eol.x = term->cols;
    if (poslt(term->curs, term->selend) && poslt(term->selstart, eol)) {
        pos okstart = term->curs;
        pos okend = eol;
        if (dir > 0) {
            /* Insertion: n characters at EOL will be splatted. */
            okend.x -= n;
        } else {
            /* Deletion: n characters at cursor position will be splatted. */
            okstart.x += n;
        }
        if (posle(okstart, term->selstart) && posle(term->selend, okend)) {
            /* Selection is contained entirely in the interval
             * [okstart,okend), so we need only adjust the selection
             * bounds. */
            term->selstart.x += dir * n;
            term->selend.x += dir * n;
            assert(term->selstart.x >= term->curs.x);
            assert(term->selstart.x < term->cols);
            assert(term->selend.x > term->curs.x);
            assert(term->selend.x <= term->cols);
        } else {
            /* Selection is not wholly contained in that interval, so
             * we must unhighlight it. */
            deselect(term);
        }
    }

    check_boundary(term, term->curs.x, term->curs.y);
    if (dir < 0)
        check_boundary(term, term->curs.x + n, term->curs.y);
    ldata = scrlineptr(term->curs.y);
    check_trust_status(term, ldata);
    if (dir < 0) {
        for (j = 0; j < m; j++)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j,
                          ldata->chars + term->curs.x + j + n);
        while (n--)
            copy_termchar(ldata, term->curs.x + m++, &term->erase_char);
    } else {
        for (j = m; j-- ;)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j + n,
                          ldata->chars + term->curs.x + j);
        while (n--)
            copy_termchar(ldata, term->curs.x + n, &term->erase_char);
    }
}